

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

double __thiscall HEkk::computeDualSteepestEdgeWeight(HEkk *this,HighsInt iRow,HVector *row_ep)

{
  reference pvVar1;
  reference pvVar2;
  long in_RDX;
  value_type in_ESI;
  HEkk *in_RDI;
  double dVar3;
  HVectorBase<double> *unaff_retaddr;
  double local_row_ep_density;
  HighsTimerClock *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  HSimplexNla *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  value_type vVar4;
  
  HVectorBase<double>::clear((HVectorBase<double> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined4 *)(in_RDX + 4) = 1;
  vVar4 = in_ESI;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDX + 8),0);
  *pvVar1 = in_ESI;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)vVar4);
  *pvVar2 = 1.0;
  *(undefined1 *)(in_RDX + 0x78) = 0;
  HSimplexNla::btranInScaledSpace
            (in_stack_ffffffffffffffe0,(HVector *)in_RDI,
             (double)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  updateOperationResultDensity
            (in_RDI,((double)*(int *)(in_RDX + 4) * 1.0) / (double)(in_RDI->lp_).num_row_,
             &(in_RDI->info_).row_ep_density);
  dVar3 = HVectorBase<double>::norm2(unaff_retaddr);
  return dVar3;
}

Assistant:

double HEkk::computeDualSteepestEdgeWeight(const HighsInt iRow,
                                           HVector& row_ep) {
  row_ep.clear();
  row_ep.count = 1;
  row_ep.index[0] = iRow;
  row_ep.array[iRow] = 1;
  row_ep.packFlag = false;
  simplex_nla_.btranInScaledSpace(row_ep, info_.row_ep_density,
                                  analysis_.pointer_serial_factor_clocks);
  const double local_row_ep_density = (1.0 * row_ep.count) / lp_.num_row_;
  updateOperationResultDensity(local_row_ep_density, info_.row_ep_density);
  return row_ep.norm2();
}